

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O0

int bit_array_test(void *array,size_t bit)

{
  uchar *ptr;
  size_t *size;
  size_t bit_local;
  void *array_local;
  int local_4;
  
  if (((array == (void *)0x0) || (*array <= bit)) ||
     (((uint)*(byte *)((long)array + (bit >> 3) + 8) & 1 << ((byte)bit & 7)) == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int bit_array_test(void * array, size_t bit)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		if (bit < *size)
		{
			unsigned char * ptr = (unsigned char *)(size + 1);
			if (ptr[bit >> 3] & (1U << (bit & 7)))
			{
				return 1;
			}
		}
	}
	return 0;
}